

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmShiftIm<(moira::Instr)70,(moira::Mode)11,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  uint uVar4;
  byte bVar5;
  char *pcVar6;
  char cVar7;
  
  uVar4 = 8;
  if ((op >> 9 & 7) != 0) {
    uVar4 = op >> 9 & 7;
  }
  bVar5 = str->upper;
  pcVar6 = "lsr";
  if ((bool)bVar5 != false) {
    pcVar6 = "LSR";
  }
  cVar7 = *pcVar6;
  if (cVar7 != '\0') {
    do {
      pcVar6 = pcVar6 + 1;
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar7;
      cVar7 = *pcVar6;
    } while (cVar7 != '\0');
    bVar5 = str->upper;
  }
  s = &str->ptr;
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = '.';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (~bVar5 & 1) << 5 | 0x4c;
  iVar1 = (this->tab).raw;
  while (pcVar6 = str->ptr, pcVar6 < str->base + iVar1) {
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  *s = pcVar6 + 1;
  *pcVar6 = '#';
  sprintd(s,(ulong)uVar4);
  pcVar6 = *s;
  *s = pcVar6 + 1;
  *pcVar6 = ',';
  pcVar6 = *s;
  *s = pcVar6 + 1;
  *pcVar6 = ' ';
  pcVar6 = *s;
  *s = pcVar6 + 1;
  *pcVar6 = 'D';
  pbVar3 = (byte *)*s;
  *s = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)op & 7 | 0x30;
  return;
}

Assistant:

void
Moira::dasmShiftIm(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Imd ( ____xxx_________(op) );
    auto dst = Dn  ( _____________xxx(op) );

    if (src.raw == 0) src.raw = 8;
    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}